

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O2

SRes LzmaDecode(Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,Byte *propData,uint propSize,
               ELzmaFinishMode finishMode,ELzmaStatus *status,ISzAllocPtr alloc)

{
  SizeT dicLimit;
  ulong uVar1;
  SRes SVar2;
  CLzmaDec local_b0;
  
  dicLimit = *destLen;
  uVar1 = *srcLen;
  *srcLen = 0;
  *destLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  if (uVar1 < 5) {
    SVar2 = 6;
  }
  else {
    local_b0.dic = (Byte *)0x0;
    local_b0.probs = (CLzmaProb *)0x0;
    SVar2 = LzmaDec_AllocateProbs(&local_b0,propData,propSize,alloc);
    if (SVar2 == 0) {
      local_b0.dicPos = 0;
      local_b0.tempBufSize = 0;
      local_b0.processedPos = 0;
      local_b0.checkDicSize = 0;
      local_b0.remainLen = 0x114;
      *srcLen = uVar1;
      local_b0.dic = dest;
      local_b0.dicBufSize = dicLimit;
      SVar2 = LzmaDec_DecodeToDic(&local_b0,dicLimit,src,srcLen,finishMode,status);
      *destLen = local_b0.dicPos;
      if (SVar2 == 0) {
        SVar2 = 6;
        if (*status != LZMA_STATUS_NEEDS_MORE_INPUT) {
          SVar2 = 0;
        }
      }
      (*alloc->Free)(alloc,local_b0.probs);
    }
  }
  return SVar2;
}

Assistant:

SRes LzmaDecode(Byte *dest, SizeT *destLen, const Byte *src, SizeT *srcLen,
    const Byte *propData, unsigned propSize, ELzmaFinishMode finishMode,
    ELzmaStatus *status, ISzAllocPtr alloc)
{
  CLzmaDec p;
  SRes res;
  SizeT outSize = *destLen, inSize = *srcLen;
  *destLen = *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  if (inSize < RC_INIT_SIZE)
    return SZ_ERROR_INPUT_EOF;
  LzmaDec_CONSTRUCT(&p)
  RINOK(LzmaDec_AllocateProbs(&p, propData, propSize, alloc))
  p.dic = dest;
  p.dicBufSize = outSize;
  LzmaDec_Init(&p);
  *srcLen = inSize;
  res = LzmaDec_DecodeToDic(&p, outSize, src, srcLen, finishMode, status);
  *destLen = p.dicPos;
  if (res == SZ_OK && *status == LZMA_STATUS_NEEDS_MORE_INPUT)
    res = SZ_ERROR_INPUT_EOF;
  LzmaDec_FreeProbs(&p, alloc);
  return res;
}